

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_valddi.cpp
# Opt level: O2

ze_result_t
validation_layer::zeCommandListCreateImmediate
          (ze_context_handle_t hContext,ze_device_handle_t hDevice,ze_command_queue_desc_t *altdesc,
          ze_command_list_handle_t *phCommandList)

{
  Logger *this;
  long *plVar1;
  ze_result_t result;
  ze_result_t zVar2;
  size_t i;
  long lVar3;
  long lVar4;
  long lVar5;
  allocator local_61;
  ze_command_list_handle_t *local_60;
  code *local_58;
  string local_50;
  
  lVar4 = context;
  this = *(Logger **)(context + 0xd50);
  local_60 = phCommandList;
  std::__cxx11::string::string
            ((string *)&local_50,
             "zeCommandListCreateImmediate(hContext, hDevice, altdesc, phCommandList)",&local_61);
  loader::Logger::log_trace(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (*(code **)(lVar4 + 0x220) == (code *)0x0) {
    result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    lVar5 = *(long *)(lVar4 + 0xd38) - *(long *)(lVar4 + 0xd30) >> 3;
    lVar3 = 0;
    local_58 = *(code **)(lVar4 + 0x220);
    do {
      if (lVar5 == lVar3) {
        if ((*(char *)(context + 4) != '\x01') ||
           (result = ZEHandleLifetimeValidation::zeCommandListCreateImmediatePrologue
                               (*(ZEHandleLifetimeValidation **)(context + 0xd48),hContext,hDevice,
                                altdesc,local_60), result == ZE_RESULT_SUCCESS)) {
          zVar2 = (*local_58)(hContext,hDevice,altdesc,local_60);
          lVar4 = 0;
          goto LAB_0014aacc;
        }
        break;
      }
      plVar1 = (long *)**(undefined8 **)(*(long *)(context + 0xd30) + lVar3 * 8);
      result = (**(code **)(*plVar1 + 0x240))(plVar1,hContext,hDevice,altdesc,local_60);
      lVar3 = lVar3 + 1;
    } while (result == ZE_RESULT_SUCCESS);
  }
  goto LAB_0014ab09;
  while( true ) {
    plVar1 = (long *)**(undefined8 **)(*(long *)(context + 0xd30) + lVar4 * 8);
    result = (**(code **)(*plVar1 + 0x248))(plVar1,hContext,hDevice,altdesc,local_60,zVar2);
    lVar4 = lVar4 + 1;
    if (result != ZE_RESULT_SUCCESS) break;
LAB_0014aacc:
    if (lVar5 == lVar4) {
      result = zVar2;
      if (((zVar2 == ZE_RESULT_SUCCESS) && (local_60 != (ze_command_list_handle_t *)0x0)) &&
         (*(char *)(context + 4) != '\0')) {
        HandleLifetimeValidation::addHandle
                  (*(HandleLifetimeValidation **)(context + 0xd48),*local_60,false);
      }
      break;
    }
  }
LAB_0014ab09:
  logAndPropagateResult("zeCommandListCreateImmediate",result);
  return result;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeCommandListCreateImmediate(
        ze_context_handle_t hContext,                   ///< [in] handle of the context object
        ze_device_handle_t hDevice,                     ///< [in] handle of the device object
        const ze_command_queue_desc_t* altdesc,         ///< [in] pointer to command queue descriptor
        ze_command_list_handle_t* phCommandList         ///< [out] pointer to handle of command list object created
        )
    {
        context.logger->log_trace("zeCommandListCreateImmediate(hContext, hDevice, altdesc, phCommandList)");

        auto pfnCreateImmediate = context.zeDdiTable.CommandList.pfnCreateImmediate;

        if( nullptr == pfnCreateImmediate )
            return logAndPropagateResult("zeCommandListCreateImmediate", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeCommandListCreateImmediatePrologue( hContext, hDevice, altdesc, phCommandList );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeCommandListCreateImmediate", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zeHandleLifetime.zeCommandListCreateImmediatePrologue( hContext, hDevice, altdesc, phCommandList );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeCommandListCreateImmediate", result);
        }

        auto driver_result = pfnCreateImmediate( hContext, hDevice, altdesc, phCommandList );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeCommandListCreateImmediateEpilogue( hContext, hDevice, altdesc, phCommandList ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeCommandListCreateImmediate", result);
        }


        if( driver_result == ZE_RESULT_SUCCESS && context.enableHandleLifetime ){
            
            if (phCommandList){
                context.handleLifetime->addHandle( *phCommandList , false);
            }
        }
        return logAndPropagateResult("zeCommandListCreateImmediate", driver_result);
    }